

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O0

void __thiscall
wasm::HashStringifyWalker::addUniqueSymbol(HashStringifyWalker *this,SeparatorReason reason)

{
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::Name>_>,_bool> pVar1;
  value_type local_68;
  value_type_conflict2 local_5c;
  _Base_ptr local_58;
  undefined1 local_50;
  size_type local_48;
  pair<const_unsigned_int,_wasm::Name> local_40;
  FuncStart *local_28;
  FuncStart *funcStart;
  HashStringifyWalker *this_local;
  SeparatorReason reason_local;
  
  funcStart = (FuncStart *)this;
  if (this->nextVal <= (uint)this->nextSeparatorVal) {
    local_28 = StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::getFuncStart
                         ((SeparatorReason *)&this_local);
    if (local_28 != (FuncStart *)0x0) {
      local_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->hashString);
      std::pair<const_unsigned_int,_wasm::Name>::pair<unsigned_long,_wasm::Name_&,_true>
                (&local_40,&local_48,(Name *)local_28->func);
      pVar1 = std::
              map<unsigned_int,_wasm::Name,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
              ::insert(&this->idxToFuncName,&local_40);
      local_58 = (_Base_ptr)pVar1.first._M_node;
      local_50 = pVar1.second;
    }
    local_5c = this->nextSeparatorVal;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->hashString,&local_5c)
    ;
    this->nextSeparatorVal = this->nextSeparatorVal + -1;
    local_68 = (value_type)0x0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&this->exprs,&local_68);
    return;
  }
  __assert_fail("(uint32_t)nextSeparatorVal >= nextVal",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/hash-stringify-walker.cpp"
                ,0x3b,"void wasm::HashStringifyWalker::addUniqueSymbol(SeparatorReason)");
}

Assistant:

void HashStringifyWalker::addUniqueSymbol(SeparatorReason reason) {
  // Use a negative value to distinguish symbols for separators from symbols
  // for Expressions
  assert((uint32_t)nextSeparatorVal >= nextVal);
  if (auto funcStart = reason.getFuncStart()) {
    idxToFuncName.insert({hashString.size(), funcStart->func->name});
  }
  hashString.push_back((uint32_t)nextSeparatorVal);
  nextSeparatorVal--;
  exprs.push_back(nullptr);
}